

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O2

void __thiscall
Boss::Boss(Boss *this,string *id,string *name,Address *add,int hw,int sph,int wtd,int wd,
          int numberOfEmployees)

{
  string sStack_c8;
  string local_a8;
  Address local_88;
  
  std::__cxx11::string::string((string *)&local_a8,(string *)id);
  std::__cxx11::string::string((string *)&sStack_c8,(string *)name);
  Address::Address(&local_88,add);
  Employee::Employee(&this->super_Employee,&local_a8,&sStack_c8,&local_88,hw,sph,wtd,wd);
  Address::~Address(&local_88);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_operator__00108d90;
  this->numberOfEmployees = numberOfEmployees;
  return;
}

Assistant:

Boss::Boss(const std::string &id, const std::string &name, const Address &add, int hw, int sph, int wtd, int wd,
           int numberOfEmployees) : Employee(id, name, add, hw, sph, wtd, wd), numberOfEmployees(numberOfEmployees) {}